

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall despot::BaseTag::StepReward(BaseTag *this)

{
  ACT_TYPE in_EDX;
  Belief *in_RSI;
  
  StepReward((BaseTag *)
             &this[-1].memory_pool_.freelist_.
              super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
              super__Vector_impl_data._M_finish,in_RSI,in_EDX);
  return;
}

Assistant:

double BaseTag::StepReward(const Belief* belief, ACT_TYPE action) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		TagState* state = static_cast<TagState*>(particle);
		double reward = 0;
		if (action == TagAction()) {
			if (rob_[state->state_id] == opp_[state->state_id]) {
				reward = TAG_REWARD;
			} else {
				reward = -TAG_REWARD;
			}
		} else {
			reward = -1;
		}
		sum += state->weight * reward;
	}

	return sum;
}